

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall BotscriptParser::parseSwitchDefault(BotscriptParser *this)

{
  _Map_pointer ppSVar1;
  int iVar2;
  DataBuffer *this_00;
  _Elt_pointer pSVar3;
  difference_type __node_offset_1;
  difference_type __node_offset;
  long lVar4;
  int local_20;
  int local_1c;
  
  local_20 = this->m_scopeCursor;
  ppSVar1 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node;
  iVar2 = (int)((ulong)((long)(this->m_scopeStack)._deque.
                              super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                              super__Deque_impl_data._M_start._M_last -
                       (long)(this->m_scopeStack)._deque.
                             super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                             super__Deque_impl_data._M_start._M_cur) >> 3) * 0x677d46cf +
          (int)((ulong)((long)(this->m_scopeStack)._deque.
                              super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                              super__Deque_impl_data._M_finish._M_cur -
                       (long)(this->m_scopeStack)._deque.
                             super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                             super__Deque_impl_data._M_finish._M_first) >> 3) * 0x677d46cf +
          (int)((ulong)((long)ppSVar1 -
                       (long)(this->m_scopeStack)._deque.
                             super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                             super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
          (uint)(ppSVar1 == (_Map_pointer)0x0);
  if (iVar2 <= local_20) {
    local_1c = iVar2;
    error<int,int>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/list.h:257: n (%1) is not less than size() (%2)"
                   ,&local_20,&local_1c);
  }
  pSVar3 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  lVar4 = ((long)pSVar3 -
           (long)(this->m_scopeStack)._deque.
                 super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                 super__Deque_impl_data._M_start._M_first >> 3) * 0x51b3bea3677d46cf +
          (long)local_20;
  if (lVar4 == 0) {
    pSVar3 = pSVar3 + local_20;
  }
  else {
    pSVar3 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node[lVar4];
  }
  if (pSVar3->type != SCOPE_Switch) {
    error<>("default label outside switch");
  }
  local_20 = this->m_scopeCursor;
  ppSVar1 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node;
  iVar2 = (int)((ulong)((long)(this->m_scopeStack)._deque.
                              super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                              super__Deque_impl_data._M_start._M_last -
                       (long)(this->m_scopeStack)._deque.
                             super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                             super__Deque_impl_data._M_start._M_cur) >> 3) * 0x677d46cf +
          (int)((ulong)((long)(this->m_scopeStack)._deque.
                              super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                              super__Deque_impl_data._M_finish._M_cur -
                       (long)(this->m_scopeStack)._deque.
                             super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                             super__Deque_impl_data._M_finish._M_first) >> 3) * 0x677d46cf +
          (int)((ulong)((long)ppSVar1 -
                       (long)(this->m_scopeStack)._deque.
                             super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                             super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
          (uint)(ppSVar1 == (_Map_pointer)0x0);
  if (iVar2 <= local_20) {
    local_1c = iVar2;
    error<int,int>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/list.h:257: n (%1) is not less than size() (%2)"
                   ,&local_20,&local_1c);
  }
  pSVar3 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  lVar4 = ((long)pSVar3 -
           (long)(this->m_scopeStack)._deque.
                 super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                 super__Deque_impl_data._M_start._M_first >> 3) * 0x51b3bea3677d46cf +
          (long)local_20;
  if (lVar4 == 0) {
    pSVar3 = pSVar3 + local_20;
  }
  else {
    pSVar3 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node[lVar4];
  }
  if (pSVar3->buffer1 != (DataBuffer *)0x0) {
    error<>("multiple default labels in one switch");
  }
  Lexer::mustGetNext(this->m_lexer,Colon);
  this_00 = (DataBuffer *)operator_new(0xb8);
  DataBuffer::DataBuffer(this_00,0x80);
  local_20 = this->m_scopeCursor;
  ppSVar1 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node;
  iVar2 = (int)((ulong)((long)(this->m_scopeStack)._deque.
                              super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                              super__Deque_impl_data._M_start._M_last -
                       (long)(this->m_scopeStack)._deque.
                             super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                             super__Deque_impl_data._M_start._M_cur) >> 3) * 0x677d46cf +
          (int)((ulong)((long)(this->m_scopeStack)._deque.
                              super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                              super__Deque_impl_data._M_finish._M_cur -
                       (long)(this->m_scopeStack)._deque.
                             super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                             super__Deque_impl_data._M_finish._M_first) >> 3) * 0x677d46cf +
          (int)((ulong)((long)ppSVar1 -
                       (long)(this->m_scopeStack)._deque.
                             super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                             super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
          (uint)(ppSVar1 == (_Map_pointer)0x0);
  if (iVar2 <= local_20) {
    local_1c = iVar2;
    error<int,int>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/list.h:257: n (%1) is not less than size() (%2)"
                   ,&local_20,&local_1c);
  }
  pSVar3 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  lVar4 = ((long)pSVar3 -
           (long)(this->m_scopeStack)._deque.
                 super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                 super__Deque_impl_data._M_start._M_first >> 3) * 0x51b3bea3677d46cf +
          (long)local_20;
  if (lVar4 == 0) {
    pSVar3 = pSVar3 + local_20;
  }
  else {
    pSVar3 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node[lVar4];
  }
  pSVar3->buffer1 = this_00;
  DataBuffer::writeHeader(this_00,Drop);
  DataBuffer::writeHeader(this_00,Goto);
  addSwitchCase(this,this_00);
  return;
}

Assistant:

void BotscriptParser::parseSwitchDefault()
{
	if (SCOPE (0).type != SCOPE_Switch)
		error ("default label outside switch");

	if (SCOPE (0).buffer1 != null)
		error ("multiple default labels in one switch");

	m_lexer->mustGetNext (Token::Colon);

	// The default header is buffered into buffer1, since
	// it has to be the last of the case headers
	//
	// Since the expression is pushed into the switch
	// and is only popped when case succeeds, we have
	// to pop it with DataHeader::Drop manually if we end up in
	// a default.
	DataBuffer* buf = new DataBuffer;
	SCOPE (0).buffer1 = buf;
	buf->writeHeader (DataHeader::Drop);
	buf->writeHeader (DataHeader::Goto);
	addSwitchCase (buf);
}